

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateBase.hpp
# Opt level: O0

void Diligent::PipelineStateUtils::WaitUntilShaderReadyIfRequested<Diligent::ShaderVkImpl>
               (RefCntAutoPtr<Diligent::ShaderVkImpl> *pShader,bool WaitForCompletion)

{
  ShaderVkImpl *pSVar1;
  ShaderDesc *Args_1;
  Char *local_20;
  SHADER_STATUS local_18;
  undefined1 local_11;
  SHADER_STATUS ShaderStatus;
  bool WaitForCompletion_local;
  RefCntAutoPtr<Diligent::ShaderVkImpl> *pShader_local;
  
  if (WaitForCompletion) {
    local_11 = WaitForCompletion;
    _ShaderStatus = pShader;
    pSVar1 = RefCntAutoPtr<Diligent::ShaderVkImpl>::operator->(pShader);
    local_18 = ShaderBase<Diligent::EngineVkImplTraits>::GetStatus
                         (&pSVar1->super_ShaderBase<Diligent::EngineVkImplTraits>,true);
    if (local_18 != SHADER_STATUS_READY) {
      pSVar1 = RefCntAutoPtr<Diligent::ShaderVkImpl>::operator->(_ShaderStatus);
      Args_1 = DeviceObjectBase<Diligent::IShaderVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderDesc>
               ::GetDesc((DeviceObjectBase<Diligent::IShaderVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderDesc>
                          *)pSVar1);
      local_20 = GetShaderStatusString(local_18,false);
      LogError<true,char[9],char_const*,char[9],char_const*,char[99]>
                (false,"WaitUntilShaderReadyIfRequested",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
                 ,0xbc,(char (*) [9])"Shader \'",(char **)Args_1,(char (*) [9])"\' is in ",&local_20
                 ,(char (*) [99])
                  " status and cannot be used to create a pipeline state. Use GetStatus() to check the shader status."
                );
    }
  }
  return;
}

Assistant:

void WaitUntilShaderReadyIfRequested(RefCntAutoPtr<ShaderImplType>& pShader, bool WaitForCompletion)
{
    if (WaitForCompletion)
    {
        const SHADER_STATUS ShaderStatus = pShader->GetStatus(/*WaitForCompletion = */ true);
        if (ShaderStatus != SHADER_STATUS_READY)
        {
            LOG_ERROR_AND_THROW("Shader '", pShader->GetDesc().Name, "' is in ", GetShaderStatusString(ShaderStatus),
                                " status and cannot be used to create a pipeline state. Use GetStatus() to check the shader status.");
        }
    }
}